

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  int key;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar1;
  MessageLite *pMVar2;
  string *psVar3;
  string *extraout_RAX;
  Extension *pEVar4;
  MessageLite *extraout_RAX_00;
  MessageLite *extraout_RAX_01;
  MessageLite *extraout_RAX_02;
  MessageLite *extraout_RAX_03;
  MessageLite *extraout_RAX_04;
  MessageLite *extraout_RAX_05;
  MessageLite *extraout_RAX_06;
  MessageLite *extraout_RAX_07;
  MessageLite *extraout_RAX_08;
  undefined1 *puVar5;
  ExtensionSet *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  ExtensionSet EStack_50;
  undefined1 auStack_38 [16];
  
  puVar5 = auStack_38;
  this_00 = (ExtensionSet *)auStack_38;
  EStack_50.map_.flat = (KeyValue *)0x25d466;
  pVar6 = Insert(this,number);
  pEVar4 = pVar6.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated == false) goto LAB_0025d513;
    psVar3 = (string *)0x0;
LAB_0025d4c6:
    if (psVar3 == (string *)0x0) {
      if (0xed < (byte)(pEVar4->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 10
           ) {
          psVar3 = (string *)0x0;
        }
        else {
          EStack_50.map_.flat = (KeyValue *)0x25d557;
          psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar4->type * 4),10,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
        }
        if (psVar3 == (string *)0x0) goto LAB_0025d4f3;
        goto LAB_0025d56f;
      }
      EStack_50.map_.flat = (KeyValue *)0x25d530;
      AddMessage((ExtensionSet *)auStack_38);
LAB_0025d530:
      EStack_50.map_.flat = (KeyValue *)0x25d541;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)puVar5,10,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      goto LAB_0025d49d;
    }
    EStack_50.map_.flat = (KeyValue *)0x25d564;
    AddMessage();
  }
  else {
    pEVar4->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      EStack_50.map_.flat = (KeyValue *)0x25d513;
      AddMessage((ExtensionSet *)auStack_38);
LAB_0025d513:
      EStack_50.map_.flat = (KeyValue *)0x25d526;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (1,0,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                         );
      goto LAB_0025d4c6;
    }
    puVar5 = (undefined1 *)
             (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (puVar5 != (undefined1 *)0xa) goto LAB_0025d530;
    psVar3 = (string *)0x0;
LAB_0025d49d:
    if (psVar3 == (string *)0x0) {
      pEVar4->is_repeated = true;
      pEVar4->field_0xa = pEVar4->field_0xa | 1;
      EStack_50.map_.flat = (KeyValue *)0x25d4b8;
      aVar1 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::
              CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      pEVar4->field_0 = aVar1;
LAB_0025d4f3:
      pMVar2 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)pEVar4->field_0,prototype);
      return pMVar2;
    }
  }
  EStack_50.map_.flat = (KeyValue *)0x25d56f;
  AddMessage();
  psVar3 = extraout_RAX;
LAB_0025d56f:
  key = (int)psVar3;
  EStack_50.map_.flat = (KeyValue *)RemoveLast;
  AddMessage();
  EStack_50.map_ = (AllocatedData)prototype;
  pEVar4 = FindOrNull(this_00,key);
  if (pEVar4 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&EStack_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x361,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (&EStack_50,0x25,"Index out-of-bounds (field is empty).");
  }
  else {
    if (pEVar4->is_repeated == false) {
      RemoveLast(&EStack_50);
    }
    else if (0xed < (byte)(pEVar4->type - 0x13)) {
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4)) {
      case 1:
      case 8:
        RepeatedField<int>::RemoveLast((RepeatedField<int> *)pEVar4->field_0);
        return extraout_RAX_00;
      case 2:
        RepeatedField<long>::RemoveLast((RepeatedField<long> *)pEVar4->field_0);
        return extraout_RAX_03;
      case 3:
        RepeatedField<unsigned_int>::RemoveLast((RepeatedField<unsigned_int> *)pEVar4->field_0);
        return extraout_RAX_04;
      case 4:
        RepeatedField<unsigned_long>::RemoveLast((RepeatedField<unsigned_long> *)pEVar4->field_0);
        return extraout_RAX_01;
      case 5:
        RepeatedField<double>::RemoveLast((RepeatedField<double> *)pEVar4->field_0);
        return extraout_RAX_06;
      case 6:
        RepeatedField<float>::RemoveLast((RepeatedField<float> *)pEVar4->field_0);
        return extraout_RAX_07;
      case 7:
        RepeatedField<bool>::RemoveLast((RepeatedField<bool> *)pEVar4->field_0);
        return extraout_RAX_05;
      case 9:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)pEVar4->field_0);
        return extraout_RAX_08;
      case 10:
        RepeatedPtrFieldBase::
        RemoveLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  ((RepeatedPtrFieldBase *)pEVar4->field_0);
        return extraout_RAX_02;
      default:
        return (MessageLite *)pEVar4;
      }
    }
    RemoveLast(&EStack_50);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&EStack_50)
  ;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}